

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDPF.cpp
# Opt level: O0

void __thiscall EDPF::validateEdgeSegments(EDPF *this)

{
  double *pdVar1;
  short *psVar2;
  reference pvVar3;
  size_type sVar4;
  int local_1c;
  int i_1;
  int len;
  int i;
  EDPF *this_local;
  
  this->divForTestSegment = 2.25;
  memset((this->super_ED).edgeImg,0,(long)((this->super_ED).width * (this->super_ED).height));
  pdVar1 = (double *)operator_new__(0x40000);
  this->H = pdVar1;
  memset(this->H,0,0x40000);
  psVar2 = ComputePrewitt3x3(this);
  this->gradImg = psVar2;
  this->np = 0;
  for (i_1 = 0; i_1 < (this->super_ED).segmentNos; i_1 = i_1 + 1) {
    pvVar3 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::operator[](&(this->super_ED).segmentPoints,(long)i_1);
    sVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(pvVar3);
    this->np = ((int)sVar4 * ((int)sVar4 + -1)) / 2 + this->np;
  }
  for (local_1c = 0; local_1c < (this->super_ED).segmentNos; local_1c = local_1c + 1) {
    pvVar3 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::operator[](&(this->super_ED).segmentPoints,(long)local_1c);
    sVar4 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size(pvVar3);
    TestSegment(this,local_1c,0,(int)sVar4 + -1);
  }
  ExtractNewSegments(this);
  if (this->H != (double *)0x0) {
    operator_delete__(this->H);
  }
  if (this->gradImg != (short *)0x0) {
    operator_delete__(this->gradImg);
  }
  return;
}

Assistant:

void EDPF::validateEdgeSegments()
{
	divForTestSegment = 2.25; // Some magic number :-)
	memset(edgeImg, 0, width*height); // clear edge image
	
	H = new double[MAX_GRAD_VALUE];
	memset(H, 0, sizeof(double)*MAX_GRAD_VALUE);

	gradImg = ComputePrewitt3x3();

	// Compute np: # of segment pieces
#if 1
	// Does this underestimate the number of pieces of edge segments?
	// What's the correct value?
	np = 0;
	for (int i = 0; i < segmentNos; i++) {
		int len = (int)segmentPoints[i].size();
		np += (len*(len - 1)) / 2;
	} //end-for

	  //  np *= 32;
#elif 0
	// This definitely overestimates the number of pieces of edge segments
	int np = 0;
	for (int i = 0; i < segmentNos; i++) {
		np += segmentPoints[i].size();
	} //end-for
	np = (np*(np - 1)) / 2;
#endif

	// Validate segments
	for (int i = 0; i< segmentNos; i++) {
		TestSegment(i, 0, (int)segmentPoints[i].size() - 1);
	} //end-for

	ExtractNewSegments();

	// clean space		  
	delete[] H;
	delete[] gradImg;
}